

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageFileExt::~CVmImageFileExt(CVmImageFileExt *this)

{
  CVmImageFileExt_blk *pCVar1;
  CVmImageFileExt_blk *this_00;
  
  (this->super_CVmImageFile)._vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_0035f3f8;
  this_00 = this->mem_head_;
  while (this_00 != (CVmImageFileExt_blk *)0x0) {
    pCVar1 = this_00->nxt_;
    CVmImageFileExt_blk::~CVmImageFileExt_blk(this_00);
    operator_delete(this_00,0x28);
    this_00 = pCVar1;
  }
  return;
}

Assistant:

CVmImageFileExt::~CVmImageFileExt()
{
    CVmImageFileExt_blk *cur;
    CVmImageFileExt_blk *nxt;
    
    /* run through the list of allocated blocks and delete each one */
    for (cur = mem_head_ ; cur != 0 ; cur = nxt)
    {
        /* remember the next block, since we're deleting this one */
        nxt = cur->nxt_;

        /* delete this one */
        delete cur;
    }
}